

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# derive_key.cc
# Opt level: O0

int EVP_BytesToKey(EVP_CIPHER *type,EVP_MD *md,uchar *salt,uchar *data,int datal,int count,
                  uchar *key,uchar *iv)

{
  int iVar1;
  EVP_MD_CTX *pEVar2;
  uint uVar3;
  undefined4 in_register_00000084;
  bool bVar4;
  undefined1 local_c0 [8];
  ScopedEVP_MD_CTX c;
  uint niv;
  uint nkey;
  int rv;
  uint i;
  uint mds;
  uint addmd;
  uint8_t md_buf [64];
  uint count_local;
  size_t data_len_local;
  uint8_t *data_local;
  uint8_t *salt_local;
  EVP_MD *md_local;
  EVP_CIPHER *type_local;
  
  i = 0;
  rv = 0;
  niv = 0;
  c.ctx_.pctx_ops._4_4_ = EVP_CIPHER_key_length(type);
  c.ctx_.pctx_ops._0_4_ = EVP_CIPHER_iv_length(type);
  if (0x40 < c.ctx_.pctx_ops._4_4_) {
    __assert_fail("nkey <= EVP_MAX_KEY_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/derive_key.cc"
                  ,0x24,
                  "int EVP_BytesToKey(const EVP_CIPHER *, const EVP_MD *, const uint8_t *, const uint8_t *, size_t, unsigned int, uint8_t *, uint8_t *)"
                 );
  }
  if (0x10 < (uint)c.ctx_.pctx_ops) {
    __assert_fail("niv <= EVP_MAX_IV_LENGTH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/derive_key.cc"
                  ,0x25,
                  "int EVP_BytesToKey(const EVP_CIPHER *, const EVP_MD *, const uint8_t *, const uint8_t *, size_t, unsigned int, uint8_t *, uint8_t *)"
                 );
  }
  if (data == (uchar *)0x0) {
    type_local._4_4_ = c.ctx_.pctx_ops._4_4_;
  }
  else {
    bssl::internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)local_c0);
    do {
      pEVar2 = (EVP_MD_CTX *)
               bssl::internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)local_c0);
      iVar1 = EVP_DigestInit_ex(pEVar2,md,(ENGINE *)0x0);
      if (iVar1 == 0) goto LAB_00813d31;
      uVar3 = i + 1;
      bVar4 = i != 0;
      i = uVar3;
      if (bVar4) {
        pEVar2 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_c0);
        iVar1 = EVP_DigestUpdate(pEVar2,&mds,(ulong)(uint)rv);
        if (iVar1 == 0) goto LAB_00813d31;
      }
      pEVar2 = (EVP_MD_CTX *)
               bssl::internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)local_c0);
      iVar1 = EVP_DigestUpdate(pEVar2,data,CONCAT44(in_register_00000084,datal));
      if (iVar1 == 0) goto LAB_00813d31;
      if (salt != (uchar *)0x0) {
        pEVar2 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_c0);
        iVar1 = EVP_DigestUpdate(pEVar2,salt,8);
        if (iVar1 == 0) goto LAB_00813d31;
      }
      pEVar2 = (EVP_MD_CTX *)
               bssl::internal::
               StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
               ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                      *)local_c0);
      iVar1 = EVP_DigestFinal_ex(pEVar2,(uchar *)&mds,(uint *)&rv);
      if (iVar1 == 0) goto LAB_00813d31;
      for (nkey = 1; nkey < (uint)count; nkey = nkey + 1) {
        pEVar2 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_c0);
        iVar1 = EVP_DigestInit_ex(pEVar2,md,(ENGINE *)0x0);
        if (iVar1 == 0) goto LAB_00813d31;
        pEVar2 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_c0);
        iVar1 = EVP_DigestUpdate(pEVar2,&mds,(ulong)(uint)rv);
        if (iVar1 == 0) goto LAB_00813d31;
        pEVar2 = (EVP_MD_CTX *)
                 bssl::internal::
                 StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                 ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                        *)local_c0);
        iVar1 = EVP_DigestFinal_ex(pEVar2,(uchar *)&mds,(uint *)&rv);
        if (iVar1 == 0) goto LAB_00813d31;
      }
      nkey = 0;
      if (c.ctx_.pctx_ops._4_4_ != 0) {
        for (; (c.ctx_.pctx_ops._4_4_ != 0 && (nkey != rv)); nkey = nkey + 1) {
          if (key != (uchar *)0x0) {
            *key = *(uchar *)((long)&mds + (ulong)nkey);
            key = key + 1;
          }
          c.ctx_.pctx_ops._4_4_ = c.ctx_.pctx_ops._4_4_ - 1;
        }
      }
      if (((uint)c.ctx_.pctx_ops != 0) && (nkey != rv)) {
        for (; ((uint)c.ctx_.pctx_ops != 0 && (nkey != rv)); nkey = nkey + 1) {
          if (iv != (uchar *)0x0) {
            *iv = *(uchar *)((long)&mds + (ulong)nkey);
            iv = iv + 1;
          }
          c.ctx_.pctx_ops._0_4_ = (uint)c.ctx_.pctx_ops - 1;
        }
      }
    } while ((c.ctx_.pctx_ops._4_4_ != 0) || ((uint)c.ctx_.pctx_ops != 0));
    niv = EVP_CIPHER_key_length(type);
LAB_00813d31:
    OPENSSL_cleanse(&mds,0x40);
    type_local._4_4_ = niv;
    bssl::internal::
    StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
    ::~StackAllocatedMovable
              ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                *)local_c0);
  }
  return type_local._4_4_;
}

Assistant:

int EVP_BytesToKey(const EVP_CIPHER *type, const EVP_MD *md,
                   const uint8_t *salt, const uint8_t *data, size_t data_len,
                   unsigned count, uint8_t *key, uint8_t *iv) {
  uint8_t md_buf[EVP_MAX_MD_SIZE];
  unsigned addmd = 0;
  unsigned mds = 0, i;
  int rv = 0;

  unsigned nkey = EVP_CIPHER_key_length(type);
  unsigned niv = EVP_CIPHER_iv_length(type);

  assert(nkey <= EVP_MAX_KEY_LENGTH);
  assert(niv <= EVP_MAX_IV_LENGTH);

  if (data == nullptr) {
    return nkey;
  }

  bssl::ScopedEVP_MD_CTX c;
  for (;;) {
    if (!EVP_DigestInit_ex(c.get(), md, nullptr)) {
      goto err;
    }
    if (addmd++) {
      if (!EVP_DigestUpdate(c.get(), md_buf, mds)) {
        goto err;
      }
    }
    if (!EVP_DigestUpdate(c.get(), data, data_len)) {
      goto err;
    }
    if (salt != nullptr) {
      if (!EVP_DigestUpdate(c.get(), salt, PKCS5_SALT_LEN)) {
        goto err;
      }
    }
    if (!EVP_DigestFinal_ex(c.get(), md_buf, &mds)) {
      goto err;
    }

    for (i = 1; i < count; i++) {
      if (!EVP_DigestInit_ex(c.get(), md, nullptr) ||
          !EVP_DigestUpdate(c.get(), md_buf, mds) ||
          !EVP_DigestFinal_ex(c.get(), md_buf, &mds)) {
        goto err;
      }
    }

    i = 0;
    if (nkey) {
      for (;;) {
        if (nkey == 0 || i == mds) {
          break;
        }
        if (key != nullptr) {
          *(key++) = md_buf[i];
        }
        nkey--;
        i++;
      }
    }

    if (niv && i != mds) {
      for (;;) {
        if (niv == 0 || i == mds) {
          break;
        }
        if (iv != nullptr) {
          *(iv++) = md_buf[i];
        }
        niv--;
        i++;
      }
    }
    if (nkey == 0 && niv == 0) {
      break;
    }
  }
  rv = EVP_CIPHER_key_length(type);

err:
  OPENSSL_cleanse(md_buf, EVP_MAX_MD_SIZE);
  return rv;
}